

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

wchar_t read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  byte bVar2;
  mtree *mtree;
  __mode_t p;
  wchar_t wVar3;
  wchar_t wVar4;
  mode_t mVar5;
  int iVar6;
  mtree_entry *pmVar7;
  int *piVar8;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar9;
  archive_string *paVar10;
  ushort **ppuVar11;
  size_t sVar12;
  mtree_entry **ppmVar13;
  archive_rb_node *paVar14;
  archive_rb_node *paVar15;
  size_t len;
  mtree_entry *pmVar16;
  la_int64_t lVar17;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  size_t sVar24;
  __dev_t _Var25;
  mtree_entry *pmVar26;
  mtree_entry *pmVar27;
  mtree_option *pmVar28;
  archive_rb_tree *rbt;
  char *pcVar29;
  long lVar30;
  uint uVar31;
  mtree_entry *local_130;
  wchar_t local_11c;
  mtree_option *global;
  mtree_entry *local_110;
  mtree_entry *local_108;
  mtree_entry *local_100;
  archive_rb_tree *local_f8;
  ulong local_f0;
  mtree_entry *local_e8;
  mtree_entry *local_e0;
  archive_rb_tree *local_d8;
  archive_entry *sparse_entry;
  mtree_entry **local_c8;
  stat_conflict1 st_storage;
  
  mtree = (mtree *)a->format->data;
  if (L'\xffffffff' < mtree->fd) {
    close(mtree->fd);
    mtree->fd = L'\xffffffff';
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return L'\xffffffe2';
    }
    local_c8 = &mtree->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = L'\x00080000';
    mtree->archive_format_name = "mtree";
    global = (mtree_option *)0x0;
    detect_form(a,(wchar_t *)&sparse_entry);
    local_d8 = &mtree->rbtree;
    local_110 = (mtree_entry *)0x0;
    local_f8 = (archive_rb_tree *)0x1;
LAB_004bc757:
    lVar30 = 0;
    local_130 = (mtree_entry *)0x0;
    while (__s = __archive_read_ahead(a,1,(ssize_t *)&st_storage), _Var25 = st_storage.st_dev,
          __s != (void *)0x0) {
      if ((long)st_storage.st_dev < 0) goto LAB_004bcf1d;
      pvVar9 = memchr(__s,10,st_storage.st_dev);
      if (pvVar9 != (void *)0x0) {
        _Var25 = (long)pvVar9 + (1 - (long)__s);
        st_storage.st_dev = _Var25;
      }
      if (0xffff < (long)(_Var25 + (long)local_130)) {
        pcVar18 = "Line too long";
        iVar6 = 0x54;
        goto LAB_004bcef9;
      }
      paVar10 = archive_string_ensure((archive_string *)mtree,_Var25 + (long)local_130 + 1);
      if (paVar10 == (archive_string *)0x0) {
        pcVar18 = "Can\'t allocate working buffer";
        iVar6 = 0xc;
        goto LAB_004bcef9;
      }
      memcpy((mtree->line).s + (long)local_130,__s,st_storage.st_dev);
      __archive_read_consume(a,st_storage.st_dev);
      lVar19 = st_storage.st_dev + (long)local_130;
      (mtree->line).s[lVar19] = '\0';
      pmVar7 = (mtree_entry *)(mtree->line).s;
      pcVar18 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar30);
LAB_004bc819:
      cVar1 = *pcVar18;
      if (cVar1 == '#') {
        if (pvVar9 == (void *)0x0) goto LAB_004bc85b;
LAB_004bc84a:
        pcVar18 = pcVar18 + 1;
        goto LAB_004bc819;
      }
      if (cVar1 != '\\') {
        if (cVar1 == '\0') goto LAB_004bc85b;
        if (cVar1 == '\n') {
          if (lVar19 == 0) break;
          if (lVar19 < 0) {
            wVar3 = (wchar_t)lVar19;
            goto LAB_004bcf21;
          }
          lVar30 = 0;
          pmVar26 = pmVar7;
          goto LAB_004bc888;
        }
        goto LAB_004bc84a;
      }
      if (pcVar18[1] == '\0') goto LAB_004bc84a;
      if (pcVar18[1] != '\n') {
        pcVar18 = pcVar18 + 1;
        goto LAB_004bc84a;
      }
      *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar19 + -2) = '\0';
      lVar19 = lVar19 + -2;
      pmVar7 = (mtree_entry *)(mtree->line).s;
LAB_004bc85b:
      lVar30 = (long)pcVar18 - (long)pmVar7;
      local_130 = (mtree_entry *)lVar19;
    }
    mtree->this_entry = mtree->entries;
    wVar3 = L'\0';
    goto LAB_004bcf21;
  }
LAB_004bc345:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  paVar10 = &mtree->current_dir;
  rbt = &mtree->rbtree;
  pmVar7 = mtree->this_entry;
  local_f8 = rbt;
  do {
    if (pmVar7 == (mtree_entry *)0x0) {
      return L'\x01';
    }
    pcVar18 = pmVar7->name;
    if (((*pcVar18 == '.') && (pcVar18[1] == '.')) && (pcVar18[2] == '\0')) {
      pmVar7->used = '\x01';
      sVar24 = (mtree->current_dir).length;
      if (sVar24 != 0) {
        pcVar18 = paVar10->s;
        pcVar23 = pcVar18 + sVar24;
        do {
          pcVar29 = pcVar23;
          pcVar23 = pcVar29 + -1;
          if (pcVar23 < pcVar18) break;
        } while (*pcVar23 != '/');
        pcVar29 = pcVar29 + -2;
        if (pcVar23 < pcVar18) {
          pcVar29 = pcVar23;
        }
        (mtree->current_dir).length = (size_t)(pcVar29 + (1 - (long)pcVar18));
      }
    }
    else if (pmVar7->used == '\0') {
      pmVar7->used = '\x01';
      global = (mtree_option *)entry;
      archive_entry_set_filetype(entry,0x8000);
      archive_entry_set_size(entry,0);
      (mtree->contents_name).length = 0;
      local_11c = L'\0';
      wVar3 = parse_line(a,entry,mtree,pmVar7,&local_11c);
      if (pmVar7->full == '\0') {
        sVar24 = (mtree->current_dir).length;
        if (sVar24 != 0) {
          archive_strcat(paVar10,"/");
        }
        archive_strcat(paVar10,pmVar7->name);
        archive_entry_copy_pathname(entry,paVar10->s);
        mVar5 = archive_entry_filetype(entry);
        rbt = local_f8;
        if (mVar5 != 0x4000) {
          (mtree->current_dir).length = sVar24;
        }
      }
      else {
        archive_entry_copy_pathname(entry,pmVar7->name);
        for (pmVar7 = (mtree_entry *)__archive_rb_tree_find_node(rbt,pmVar7->name);
            pmVar7 != (mtree_entry *)0x0; pmVar7 = pmVar7->next_dup) {
          if ((pmVar7->full != '\0') && (pmVar7->used == '\0')) {
            pmVar7->used = '\x01';
            wVar4 = parse_line(a,entry,mtree,pmVar7,&local_11c);
            if (wVar4 < wVar3) {
              wVar3 = wVar4;
            }
          }
        }
      }
      if (mtree->checkfs == '\0') goto LAB_004bce8f;
      mtree->fd = L'\xffffffff';
      if ((mtree->contents_name).length == 0) {
        pcVar18 = archive_entry_pathname(entry);
      }
      else {
        pcVar18 = (mtree->contents_name).s;
      }
      mVar5 = archive_entry_filetype(entry);
      if ((mVar5 == 0x8000) || (mVar5 = archive_entry_filetype(entry), mVar5 == 0x4000)) {
        wVar4 = open(pcVar18,0x80000);
        mtree->fd = wVar4;
        __archive_ensure_cloexec_flag(wVar4);
        wVar4 = mtree->fd;
        if (wVar4 == L'\xffffffff') {
          piVar8 = __errno_location();
          if ((*piVar8 != 2) || ((mtree->contents_name).length != 0)) {
            archive_set_error(&a->archive,*piVar8,"Can\'t open %s",pcVar18);
            wVar3 = L'\xffffffec';
          }
          goto LAB_004bc529;
        }
      }
      else {
LAB_004bc529:
        wVar4 = mtree->fd;
      }
      if (wVar4 < L'\0') {
        iVar6 = lstat(pcVar18,(stat *)&st_storage);
        if (iVar6 == -1) goto LAB_004bc5b9;
LAB_004bc57d:
        p = st_storage.st_mode;
        uVar31 = st_storage.st_mode & 0xf000;
        if (uVar31 == 0xa000) {
          mVar5 = archive_entry_filetype(entry);
          if (mVar5 != 0xa000) goto LAB_004bc628;
        }
        else if ((uVar31 != 0x8000) || (mVar5 = archive_entry_filetype(entry), mVar5 != 0x8000)) {
LAB_004bc628:
          if (((~p & 0xc000) != 0) || (mVar5 = archive_entry_filetype(entry), mVar5 != 0xc000)) {
            switch(uVar31 - 0x1000 >> 0xc) {
            case 0:
              mVar5 = archive_entry_filetype(entry);
              if (mVar5 == 0x1000) goto LAB_004bcd57;
              break;
            case 1:
              mVar5 = archive_entry_filetype(entry);
              if (mVar5 == 0x2000) goto LAB_004bcd57;
              break;
            case 3:
              mVar5 = archive_entry_filetype(entry);
              if (mVar5 == 0x4000) goto LAB_004bcd57;
              break;
            case 5:
              mVar5 = archive_entry_filetype(entry);
              if (mVar5 == 0x6000) goto LAB_004bcd57;
            }
            if (L'\xffffffff' < mtree->fd) {
              close(mtree->fd);
            }
            mtree->fd = L'\xffffffff';
            if ((local_11c & 0x800U) == 0) {
              if (wVar3 != L'\0') {
                return wVar3;
              }
              pcVar18 = archive_entry_pathname(entry);
              archive_set_error(&a->archive,-1,"mtree specification has different type for %s",
                                pcVar18);
              return L'\xffffffec';
            }
            goto LAB_004bc6d6;
          }
        }
LAB_004bcd57:
        wVar4 = local_11c;
        if (((local_11c & 0x1001U) != 1) &&
           ((mVar5 = archive_entry_filetype(entry), mVar5 == 0x2000 ||
            (mVar5 = archive_entry_filetype(entry), mVar5 == 0x6000)))) {
          archive_entry_set_rdev(entry,st_storage.st_rdev);
        }
        if ((wVar4 & 0xcU) == 0 || ((uint)wVar4 >> 0xc & 1) != 0) {
          archive_entry_set_gid(entry,(ulong)st_storage.st_gid);
        }
        if ((wVar4 & 0x600U) == 0 || ((uint)wVar4 >> 0xc & 1) != 0) {
          archive_entry_set_uid(entry,(ulong)st_storage.st_uid);
        }
        if ((wVar4 & 0x1010U) != 0x10) {
          archive_entry_set_mtime(entry,st_storage.st_mtim.tv_sec,st_storage.st_mtim.tv_nsec);
        }
        if ((wVar4 & 0x1020U) != 0x20) {
          archive_entry_set_nlink(entry,(uint)st_storage.st_nlink);
        }
        if ((wVar4 & 0x1040U) != 0x40) {
          archive_entry_set_perm(entry,p);
        }
        if ((wVar4 & 0x1080U) != 0x80) {
          archive_entry_set_size(entry,st_storage.st_size);
        }
        archive_entry_set_ino(entry,st_storage.st_ino);
        archive_entry_set_dev(entry,st_storage.st_dev);
        archive_entry_linkify(mtree->resolver,(archive_entry **)&global,&sparse_entry);
        entry = (archive_entry *)global;
LAB_004bce8f:
        lVar17 = archive_entry_size(entry);
        mtree->cur_size = lVar17;
        mtree->offset = 0;
        return wVar3;
      }
      iVar6 = fstat(wVar4,(stat *)&st_storage);
      if (iVar6 != -1) goto LAB_004bc57d;
      piVar8 = __errno_location();
      archive_set_error(&a->archive,*piVar8,"Could not fstat %s",pcVar18);
      close(mtree->fd);
      mtree->fd = L'\xffffffff';
      wVar3 = L'\xffffffec';
LAB_004bc5b9:
      if ((local_11c & 0x800U) == 0) goto LAB_004bce8f;
LAB_004bc6d6:
      pmVar7 = mtree->this_entry;
    }
    pmVar7 = pmVar7->next;
    mtree->this_entry = pmVar7;
  } while( true );
LAB_004bc888:
  pmVar26 = (mtree_entry *)((long)(pmVar26->rbnode).rb_nodes + 1);
  bVar2 = *(byte *)((long)(pmVar7->rbnode).rb_nodes + lVar30);
  uVar21 = (ulong)bVar2;
  if (0x23 < uVar21) goto LAB_004bc8bb;
  if ((0x100000200U >> (uVar21 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar21 & 0x3f) & 1) != 0) goto LAB_004bc8b1;
    goto LAB_004bc8bb;
  }
  lVar30 = lVar30 + 1;
  goto LAB_004bc888;
LAB_004bc8bb:
  pmVar27 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + lVar30);
  local_f0 = (st_storage.st_dev + (long)local_130) - lVar30;
  local_130 = (mtree_entry *)((long)pmVar27 + (local_f0 - 1));
  local_108 = pmVar7;
  local_100 = pmVar27;
  while (iVar6 = (int)sparse_entry, pmVar27 < local_130) {
    ppuVar11 = __ctype_b_loc();
    paVar14 = &pmVar27->rbnode;
    pmVar27 = (mtree_entry *)((long)(pmVar27->rbnode).rb_nodes + 1);
    if ((*(byte *)((long)*ppuVar11 + (ulong)*(byte *)paVar14->rb_nodes * 2 + 1) & 0x40) == 0)
    goto LAB_004bcf02;
  }
  if (bVar2 != 0x2f) {
    local_e8 = (mtree_entry *)malloc(0x40);
    pmVar27 = local_100;
    pmVar7 = local_108;
    if (local_e8 != (mtree_entry *)0x0) {
      *(undefined8 *)((long)&local_e8->options + 2) = 0;
      *(undefined8 *)((long)&local_e8->name + 2) = 0;
      local_e8->next = (mtree_entry *)0x0;
      local_e8->options = (mtree_option *)0x0;
      ppmVar13 = &local_110->next;
      if (local_110 == (mtree_entry *)0x0) {
        ppmVar13 = local_c8;
      }
      *ppmVar13 = local_e8;
      local_e0 = local_e8;
      if (iVar6 == 0) {
        pcVar18 = (char *)strcspn((char *)local_100," \t\r\n");
        pmVar7 = (mtree_entry *)(pcVar18 + (long)((long)(pmVar7->rbnode).rb_nodes + lVar30));
        local_110 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + local_f0);
      }
      else {
        uVar21 = local_f0;
        while (((uVar22 = (long)local_f0 >> 0x3f & local_f0, 0 < (long)uVar21 &&
                (uVar20 = (ulong)*(byte *)(local_130->rbnode).rb_nodes, uVar22 = uVar21,
                uVar20 < 0x21)) && ((0x100002600U >> (uVar20 & 0x3f) & 1) != 0))) {
          uVar21 = uVar21 - 1;
          local_130 = (mtree_entry *)&local_130[-1].field_0x3f;
        }
        uVar21 = 0;
        if (0 < (long)uVar22) {
          uVar21 = uVar22;
        }
        while (uVar21 != 0) {
          if (((ulong)(byte)pmVar26[-1].field_0x3f < 0x21) &&
             ((0x100002600U >> ((ulong)(byte)pmVar26[-1].field_0x3f & 0x3f) & 1) != 0)) {
            pmVar27 = pmVar26;
          }
          pmVar26 = (mtree_entry *)((long)(pmVar26->rbnode).rb_nodes + 1);
          uVar21 = uVar21 - 1;
        }
        pcVar18 = (char *)((long)local_108 + lVar30 + (uVar22 - (long)pmVar27));
        pmVar7 = local_100;
        local_110 = pmVar27;
      }
      pcVar23 = (char *)malloc((size_t)(pcVar18 + 1));
      pmVar26 = local_e0;
      local_e0->name = pcVar23;
      if (pcVar23 != (char *)0x0) {
        memcpy(pcVar23,pmVar27,(size_t)pcVar18);
        pcVar23[(long)pcVar18] = '\0';
        parse_escapes(pcVar23,pmVar26);
        pmVar27 = local_e8;
        pmVar26->next_dup = (mtree_entry *)0x0;
        if ((pmVar26->full != '\0') &&
           (iVar6 = __archive_rb_tree_insert_node(local_d8,&pmVar26->rbnode), iVar6 == 0)) {
          paVar14 = __archive_rb_tree_find_node(local_d8,pmVar26->name);
          do {
            paVar15 = paVar14;
            paVar14 = paVar15[1].rb_nodes[0];
          } while (paVar14 != (archive_rb_node *)0x0);
          paVar15[1].rb_nodes[0] = &pmVar26->rbnode;
        }
        pmVar28 = (mtree_option *)&global;
        while (pmVar28 = pmVar28->next, pmVar26 = (mtree_entry *)&pmVar27->options,
              pmVar28 != (mtree_option *)0x0) {
          pcVar18 = pmVar28->value;
          sVar12 = strlen(pcVar18);
          wVar3 = add_option(a,&pmVar27->options,pcVar18,sVar12);
          if (wVar3 != L'\0') goto LAB_004bcf21;
        }
        while ((local_e8 = pmVar26, sVar12 = strspn((char *)pmVar7," \t\r\n"),
               *(char *)((long)(pmVar7->rbnode).rb_nodes + sVar12) != '\0' &&
               (pmVar26 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + sVar12),
               pmVar26 < local_110))) {
          len = strcspn((char *)pmVar26," \t\r\n");
          pmVar7 = (mtree_entry *)((long)(pmVar26->rbnode).rb_nodes + len);
          pmVar16 = (mtree_entry *)strchr((char *)pmVar26,0x3d);
          pmVar27 = local_e8;
          sVar12 = (long)pmVar16 - (long)pmVar26;
          if (pmVar7 < pmVar16) {
            sVar12 = len;
          }
          if (pmVar16 == (mtree_entry *)0x0) {
            sVar12 = len;
          }
          remove_option((mtree_option **)local_e8,(char *)pmVar26,sVar12);
          wVar3 = add_option(a,(mtree_option **)pmVar27,(char *)pmVar26,len);
          pmVar26 = local_e8;
          if (wVar3 != L'\0') goto LAB_004bcf21;
        }
        local_110 = local_e0;
        goto LAB_004bc8b1;
      }
    }
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    pcVar18 = "Can\'t allocate memory";
    goto LAB_004bcef9;
  }
  if (4 < (long)local_f0) {
    iVar6 = strncmp((char *)local_100,"/set",4);
    if (iVar6 == 0) {
      cVar1 = *(char *)((long)(local_108->rbnode).rb_nodes + lVar30 + 4);
      if ((cVar1 == ' ') || (cVar1 == '\t')) {
        pcVar18 = (char *)((long)(local_108->rbnode).rb_nodes + lVar30 + 4);
        while (sVar12 = strspn(pcVar18," \t\r\n"), pcVar18[sVar12] != '\0') {
          pcVar29 = pcVar18 + sVar12;
          sVar12 = strcspn(pcVar29," \t\r\n");
          pcVar18 = pcVar29 + sVar12;
          pcVar23 = strchr(pcVar29,0x3d);
          sVar24 = (long)pcVar23 - (long)pcVar29;
          if (pcVar18 < pcVar23) {
            sVar24 = sVar12;
          }
          remove_option(&global,pcVar29,sVar24);
          wVar3 = add_option(a,&global,pcVar29,sVar12);
          if (wVar3 != L'\0') goto LAB_004bcf21;
        }
        goto LAB_004bc8b1;
      }
    }
    else if (((6 < local_f0) && (iVar6 = strncmp((char *)local_100,"/unset",6), iVar6 == 0)) &&
            ((cVar1 = *(char *)((long)(local_108->rbnode).rb_nodes + lVar30 + 6), cVar1 == ' ' ||
             (cVar1 == '\t')))) {
      pcVar23 = (char *)((long)(local_108->rbnode).rb_nodes + lVar30 + 6);
      pcVar18 = strchr(pcVar23,0x3d);
      if (pcVar18 != (char *)0x0) goto LAB_004bcf68;
      while( true ) {
        sVar12 = strspn(pcVar23," \t\r\n");
        cVar1 = pcVar23[sVar12];
        if (cVar1 == '\0') break;
        pcVar23 = pcVar23 + sVar12;
        sVar12 = strcspn(pcVar23," \t\r\n");
        if (((cVar1 == 'a' && sVar12 == 3) && (pcVar23[1] == 'l')) && (pcVar23[2] == 'l')) {
          free_options(global);
          global = (mtree_option *)0x0;
        }
        else {
          remove_option(&global,pcVar23,sVar12);
        }
        pcVar23 = pcVar23 + sVar12;
      }
LAB_004bc8b1:
      local_f8 = (archive_rb_tree *)((long)local_f8 + 1);
      goto LAB_004bc757;
    }
  }
LAB_004bcf02:
  archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_f8);
  goto LAB_004bcf1d;
LAB_004bcf68:
  pcVar18 = "/unset shall not contain `=\'";
  iVar6 = -1;
LAB_004bcef9:
  archive_set_error(&a->archive,iVar6,pcVar18);
LAB_004bcf1d:
  wVar3 = L'\xffffffe2';
LAB_004bcf21:
  free_options(global);
  if (wVar3 != L'\0') {
    return wVar3;
  }
  goto LAB_004bc345;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}